

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocEncoding.cpp
# Opt level: O2

BoolAndByte __thiscall PDFDocEncoding::Encode(PDFDocEncoding *this,unsigned_long inUnicodeCharacter)

{
  ushort uVar1;
  ushort uVar2;
  
  if (((inUnicodeCharacter - 0xa1 < 0x5f) || (inUnicodeCharacter < 0x18)) ||
     (inUnicodeCharacter - 0x20 < 0x5f)) {
    uVar2 = (ushort)((int)inUnicodeCharacter << 8);
    uVar1 = 1;
    goto LAB_001cfaad;
  }
  uVar1 = 1;
  switch(inUnicodeCharacter) {
  case 0x2013:
    uVar2 = 0x8500;
    break;
  case 0x2014:
    uVar2 = 0x8400;
    break;
  case 0x2015:
  case 0x2016:
  case 0x2017:
  case 0x201b:
  case 0x201f:
  case 0x2023:
  case 0x2024:
  case 0x2025:
  case 0x2027:
  case 0x2028:
  case 0x2029:
  case 0x202a:
  case 0x202b:
  case 0x202c:
  case 0x202d:
  case 0x202e:
  case 0x202f:
switchD_001cfac1_caseD_2015:
    uVar1 = 0;
    uVar2 = 0;
    break;
  case 0x2018:
    uVar2 = 0x8f00;
    break;
  case 0x2019:
    uVar2 = 0x9000;
    break;
  case 0x201a:
    uVar2 = 0x9100;
    break;
  case 0x201c:
    uVar2 = 0x8d00;
    break;
  case 0x201d:
    uVar2 = 0x8e00;
    break;
  case 0x201e:
    uVar2 = 0x8c00;
    break;
  case 0x2020:
    uVar2 = 0x8100;
    break;
  case 0x2021:
    uVar2 = 0x8200;
    break;
  case 0x2022:
    uVar2 = 0x8000;
    break;
  case 0x2026:
    uVar2 = 0x8300;
    break;
  case 0x2030:
    uVar2 = 0x8b00;
    break;
  default:
    switch(inUnicodeCharacter) {
    case 0x2d8:
      uVar2 = 0x1800;
      break;
    case 0x2d9:
      uVar2 = 0x1b00;
      break;
    case 0x2da:
      uVar2 = 0x1e00;
      break;
    case 0x2db:
      uVar2 = 0x1d00;
      break;
    case 0x2dc:
      uVar2 = 0x1f00;
      break;
    case 0x2dd:
      uVar2 = 0x1c00;
      break;
    default:
      if (inUnicodeCharacter == 0x131) {
        uVar2 = 0x9a00;
        break;
      }
      if (inUnicodeCharacter == 0x141) {
        uVar2 = 0x9500;
        break;
      }
      if (inUnicodeCharacter == 0x142) {
        uVar2 = 0x9b00;
        break;
      }
      if (inUnicodeCharacter == 0x152) {
        uVar2 = 0x9600;
        break;
      }
      if (inUnicodeCharacter == 0x153) {
        uVar2 = 0x9c00;
        break;
      }
      if (inUnicodeCharacter == 0x160) {
        uVar2 = 0x9700;
        break;
      }
      if (inUnicodeCharacter == 0x161) {
        uVar2 = 0x9d00;
        break;
      }
      if (inUnicodeCharacter == 0x178) {
        uVar2 = 0x9800;
        break;
      }
      if (inUnicodeCharacter == 0x17d) {
        uVar2 = 0x9900;
        break;
      }
      if (inUnicodeCharacter == 0x17e) {
        uVar2 = 0x9e00;
        break;
      }
      if (inUnicodeCharacter == 0x192) {
        uVar2 = 0x8600;
        break;
      }
      if (inUnicodeCharacter == 0x2c6) {
        uVar2 = 0x1a00;
        break;
      }
      if (inUnicodeCharacter == 0xfb02) {
        uVar2 = 0x9400;
        break;
      }
      if (inUnicodeCharacter == 0x2039) {
        uVar2 = 0x8800;
        break;
      }
      if (inUnicodeCharacter == 0x203a) {
        uVar2 = 0x8900;
        break;
      }
      if (inUnicodeCharacter == 0x2044) {
        uVar2 = 0x8700;
        break;
      }
      if (inUnicodeCharacter == 0x20ac) {
        uVar2 = 0xa000;
        break;
      }
      if (inUnicodeCharacter == 0x2122) {
        uVar2 = 0x9200;
        break;
      }
      if (inUnicodeCharacter == 0x2212) {
        uVar2 = 0x8a00;
        break;
      }
      if (inUnicodeCharacter == 0xfb01) {
        uVar2 = 0x9300;
        break;
      }
      if (inUnicodeCharacter == 0x2c7) {
        uVar2 = 0x1900;
        break;
      }
      goto switchD_001cfac1_caseD_2015;
    }
  }
LAB_001cfaad:
  return (BoolAndByte)(uVar1 | uVar2);
}

Assistant:

BoolAndByte PDFDocEncoding::Encode(unsigned long inUnicodeCharacter)
{
	BoolAndByte result(true,0);

	if(	betweenIncluding<unsigned long>(inUnicodeCharacter,0x00,0x17) ||
		betweenIncluding<unsigned long>(inUnicodeCharacter,0x20,0x7E) ||
		betweenIncluding<unsigned long>(inUnicodeCharacter,0xA1,0xFF))
	{
		result.second = (char)inUnicodeCharacter;
	}
	else 
	{
		switch(inUnicodeCharacter)
		{
			case 0x02D8:
				result.second = 0x18;
				break;
			case 0x02C7:
				result.second = 0x19;
				break;
			case 0x02C6:
				result.second = 0x1a;
				break;
			case 0x02D9:
				result.second = 0x1b;
				break;
			case 0x02DD:
				result.second = 0x1c;
				break;
			case 0x02DB:
				result.second = 0x1d;
				break;
			case 0x02DA:
				result.second = 0x1e;
				break;
			case 0x02DC:
				result.second = 0x1f;
				break;
			case 0x2022:
				result.second = 0x80;
				break;
			case 0x2020:
				result.second = 0x81;
				break;
			case 0x2021:
				result.second = 0x82;
				break;
			case 0x2026:
				result.second = 0x83;
				break;
			case 0x2014:
				result.second = 0x84;
				break;
			case 0x2013:
				result.second = 0x85;
				break;
			case 0x192:
				result.second = 0x86;
				break;
			case 0x2044:
				result.second = 0x87;
				break;
			case 0x2039:
				result.second = 0x88;
				break;
			case 0x203A:
				result.second = 0x89;
				break;
			case 0x2212:
				result.second = 0x8a;
				break;
			case 0x2030:
				result.second = 0x8b;
				break;
			case 0x201E:
				result.second = 0x8c;
				break;
			case 0x201C:
				result.second = 0x8d;
				break;
			case 0x201D:
				result.second = 0x8e;
				break;
			case 0x2018:
				result.second = 0x8f;
				break;
			case 0x2019:
				result.second = 0x90;
				break;
			case 0x201A:
				result.second = 0x91;
				break;
			case 0x2122:
				result.second = 0x92;
				break;
			case 0xFB01:
				result.second = 0x93;
				break;
			case 0xFB02:
				result.second = 0x94;
				break;
			case 0x141:
				result.second = 0x95;
				break;
			case 0x152:
				result.second = 0x96;
				break;
			case 0x160:
				result.second = 0x97;
				break;
			case 0x178:
				result.second = 0x98;
				break;
			case 0x17D:
				result.second = 0x99;
				break;
			case 0x131:
				result.second = 0x9a;
				break;
			case 0x142:
				result.second = 0x9b;
				break;
			case 0x153:
				result.second = 0x9c;
				break;
			case 0x161:
				result.second = 0x9d;
				break;
			case 0x17E:
				result.second = 0x9e;
				break;
			case 0x20AC:
				result.second = 0xa0;
				break;
			default:
				result.first = false;
		}
	}
	return result;
}